

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::AttachmentParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::AttachmentParams> *this,Context *ctx,Params *params)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  AttachmentParams *params_00;
  string sStack_58;
  string local_38;
  
  AttachmentParams::getName_abi_cxx11_(&local_38,params,params);
  AttachmentParams::getName_abi_cxx11_(&sStack_58,params,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c40630;
  GVar1 = params->colornKind;
  GVar2 = params->depthKind;
  GVar3 = params->stencilKind;
  (this->m_params).color0Kind = params->color0Kind;
  (this->m_params).colornKind = GVar1;
  (this->m_params).depthKind = GVar2;
  (this->m_params).stencilKind = GVar3;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}